

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O2

shared_ptr<chaiscript::Boxed_Value::Data> __thiscall
chaiscript::Boxed_Value::Object_Data::get<std::out_of_range>
          (Object_Data *this,shared_ptr<std::out_of_range> *obj,bool t_return_value)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar2;
  element_type *ptr;
  undefined1 local_52;
  undefined1 local_51;
  Any local_50;
  element_type *local_48;
  Any local_40;
  undefined *local_38;
  undefined4 local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  local_48 = (obj->super___shared_ptr<std::out_of_range,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_40.m_data._M_t.
  super___uniq_ptr_impl<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
  ._M_t.
  super__Tuple_impl<0UL,_chaiscript::detail::Any::Data_*,_std::default_delete<chaiscript::detail::Any::Data>_>
  .super__Head_base<0UL,_chaiscript::detail::Any::Data_*,_false>._M_head_impl =
       (unique_ptr<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
        )&std::out_of_range::typeinfo;
  local_38 = &std::out_of_range::typeinfo;
  local_30 = 0;
  local_51 = t_return_value;
  detail::Any::Any<std::shared_ptr<std::out_of_range>,void>(&local_50,obj);
  local_52 = 0;
  sVar2 = std::
          make_shared<chaiscript::Boxed_Value::Data,chaiscript::Type_Info,chaiscript::detail::Any,bool,std::out_of_range*&,bool&>
                    ((Type_Info *)this,&local_40,(bool *)&local_50,(out_of_range **)&local_52,
                     (bool *)&local_48);
  _Var1 = sVar2.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_50.m_data._M_t.
      super___uniq_ptr_impl<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
      ._M_t.
      super__Tuple_impl<0UL,_chaiscript::detail::Any::Data_*,_std::default_delete<chaiscript::detail::Any::Data>_>
      .super__Head_base<0UL,_chaiscript::detail::Any::Data_*,_false>._M_head_impl !=
      (__uniq_ptr_data<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_50.m_data._M_t.
                          super___uniq_ptr_impl<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_chaiscript::detail::Any::Data_*,_std::default_delete<chaiscript::detail::Any::Data>_>
                          .super__Head_base<0UL,_chaiscript::detail::Any::Data_*,_false>.
                          _M_head_impl + 8))();
    _Var1._M_pi = extraout_RDX;
  }
  sVar2.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chaiscript::Boxed_Value::Data>)
         sVar2.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto get(std::shared_ptr<T> &&obj, bool t_return_value) {
        auto ptr = obj.get();
        return std::make_shared<Data>(detail::Get_Type_Info<T>::get(), chaiscript::detail::Any(std::move(obj)), false, ptr, t_return_value);
      }